

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

int __thiscall SliceUnit::deserializeSliceType(SliceUnit *this,uint8_t *buffer,uint8_t *end)

{
  BitStreamReader *this_00;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  int iVar7;
  uint num;
  
  iVar7 = -10;
  if (1 < (long)end - (long)buffer) {
    (this->super_NALUnit).nal_ref_idc = *buffer >> 5 & 3;
    bVar1 = *buffer;
    (this->super_NALUnit).nal_unit_type = bVar1 & (nuDummy|nuSliceNonIDR);
    uVar5 = 1;
    if ((bVar1 & (nuDummy|nuSliceNonIDR)) == nuSliceExt) {
      if ((ulong)((long)end - (long)buffer) < 5) {
        return -10;
      }
      uVar5 = 4;
      if ((buffer[1] == 0) && (buffer[2] == '\0')) {
        uVar5 = (ulong)(buffer[3] == '\x03') | 4;
      }
      this->non_idr_flag = buffer[1] & 0x40;
      this->anchor_pic_flag = buffer[uVar5 - 1] & 4;
    }
    this_00 = &(this->super_NALUnit).bitReader;
    BitStream::setBuffer(&this_00->super_BitStream,buffer + uVar5,end);
    (this->super_NALUnit).bitReader.m_bitLeft = 0;
    uVar3 = BitStreamReader::getCurVal
                      (this_00,(this->super_NALUnit).bitReader.super_BitStream.m_buffer);
    (this->super_NALUnit).bitReader.m_curVal = uVar3;
    (this->super_NALUnit).bitReader.m_bitLeft = 0x20;
    uVar3 = 0xffffffff;
    do {
      bVar2 = BitStreamReader::getBit(this_00);
      uVar3 = uVar3 + 1;
    } while (!bVar2);
    if (0x20 < uVar3) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_0023ca88;
      __cxa_throw(puVar6,&BitStreamException::typeinfo,std::exception::~exception);
    }
    uVar4 = BitStreamReader::getBits(this_00,uVar3);
    num = 0xffffffff;
    this->first_mb_in_slice = uVar4 + ~(-1 << ((byte)uVar3 & 0x1f));
    do {
      bVar2 = BitStreamReader::getBit(this_00);
      num = num + 1;
    } while (!bVar2);
    if (0x20 < num) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_0023ca88;
      __cxa_throw(puVar6,&BitStreamException::typeinfo,std::exception::~exception);
    }
    uVar3 = BitStreamReader::getBits(this_00,num);
    uVar3 = uVar3 + ~(-1 << ((byte)num & 0x1f));
    iVar7 = 1;
    if (uVar3 < 10) {
      this->slice_type = uVar3;
      this->orig_slice_type = uVar3;
      iVar7 = 0;
      if (4 < uVar3) {
        this->slice_type = uVar3 - 5;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int SliceUnit::deserializeSliceType(uint8_t* buffer, uint8_t* end)
{
    if (end - buffer < 2)
        return NOT_ENOUGH_BUFFER;

    const int rez = NALUnit::deserialize(buffer, end);
    if (rez != 0)
        return rez;

    try
    {
        int offset = 1;
        if (nal_unit_type == NALType::nuSliceExt)
        {
            if (end - buffer < 5)
                return NOT_ENOUGH_BUFFER;
            offset += 3;
            if (buffer[1] == 0 && buffer[2] == 0 && buffer[3] == 3)
                offset++;  // inplace decode header
            non_idr_flag = buffer[1] & 0x40;
            anchor_pic_flag = buffer[offset - 1] & 0x04;
        }

        bitReader.setBuffer(buffer + offset, end);
        first_mb_in_slice = extractUEGolombCode();
        const unsigned sliceType = extractUEGolombCode();
        if (sliceType > 9)
            return 1;
        orig_slice_type = slice_type = sliceType;
        if (slice_type > 4)
            slice_type -= 5;  // +5 flag is: all other slice at this picture must be same type

        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}